

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalflatset_p.h
# Opt level: O1

pair<QWindow_*const_*,_bool> __thiscall
QMinimalFlatSet<QWindow_*,_QVarLengthArray<QWindow_*,_20LL>,_std::less<QWindow_*>_>::insert
          (QMinimalFlatSet<QWindow_*,_QVarLengthArray<QWindow_*,_20LL>,_std::less<QWindow_*>_> *this
          ,value_type *v)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  iterator ppQVar5;
  R_conflict RVar6;
  pair<QWindow_*const_*,_bool> pVar7;
  
  RVar6 = lookup(this,v);
  ppQVar5 = RVar6.it;
  if (((undefined1  [16])RVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pvVar1 = (this->c).super_QVLABase<QWindow_*>.super_QVLABaseBase.ptr;
    QVLABase<QWindow_*>::resize_impl
              ((QVLABase<QWindow_*> *)this,0x14,&(this->c).super_QVLAStorage<8UL,_8UL,_20LL>,
               (this->c).super_QVLABase<QWindow_*>.super_QVLABaseBase.s + 1,v);
    lVar2 = (this->c).super_QVLABase<QWindow_*>.super_QVLABaseBase.s;
    pvVar3 = (this->c).super_QVLABase<QWindow_*>.super_QVLABaseBase.ptr;
    ppQVar5 = (iterator)(((long)ppQVar5 - (long)pvVar1) + (long)pvVar3);
    std::_V2::__rotate<unsigned_char*>
              (ppQVar5,(long)pvVar3 + lVar2 * 8 + -8,(void *)((long)pvVar3 + lVar2 * 8));
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar4 = 0;
  }
  pVar7._8_8_ = uVar4;
  pVar7.first = ppQVar5;
  return pVar7;
}

Assistant:

std::pair<iterator, bool> insert(const value_type &v)
    {
        QMINIMAL_FLAT_SET_PRINT_AT_END
        const auto r = lookup(v);
        if (r.exists)
            return {r.it, false};
        else
            return {c.insert(r.it, v), true};
    }